

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int iso9660_write_header(archive_write *a,archive_entry *entry)

{
  void *pvVar1;
  mode_t mVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  isoent *in_RAX;
  la_int64_t lVar6;
  isofile *file;
  int *piVar7;
  char *fmt;
  isoent *isoent;
  isoent *local_28;
  
  pvVar1 = a->format_data;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0;
  *(undefined8 *)((long)pvVar1 + 0x38) = 0;
  *(undefined4 *)((long)pvVar1 + 0x40) = 0;
  local_28 = in_RAX;
  mVar2 = archive_entry_filetype(entry);
  if ((mVar2 == 0xa000) && ((*(ushort *)((long)pvVar1 + 0x10372) & 0x180) == 0)) {
    archive_set_error(&a->archive,-1,"Ignore symlink file.");
LAB_004185e9:
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    return -0x14;
  }
  mVar2 = archive_entry_filetype(entry);
  if ((mVar2 == 0x8000) && (lVar6 = archive_entry_size(entry), 0xffffffff < lVar6)) {
    if ((*(uint *)((long)pvVar1 + 0x10370) & 0x1c000) < 0xc000) {
      archive_set_error(&a->archive,-1,"Ignore over %lld bytes file. This file too large.");
      goto LAB_004185e9;
    }
    *(undefined4 *)((long)pvVar1 + 0x40) = 1;
  }
  file = isofile_new(a,entry);
  if (file != (isofile *)0x0) {
    iVar3 = isofile_gen_utility_names(a,file);
    if ((iVar3 < -0x14) || (((file->parentdir).length == 0 && ((file->basename).length == 0)))) {
      isofile_free(file);
      return iVar3;
    }
    file->allnext = (isofile *)0x0;
    **(undefined8 **)((long)pvVar1 + 0x90) = file;
    *(isofile **)((long)pvVar1 + 0x90) = file;
    local_28 = isoent_new(file);
    if (local_28 != (isoent *)0x0) {
      iVar4 = local_28->file->dircnt;
      if (*(int *)((long)pvVar1 + 0x2d8) < iVar4) {
        *(int *)((long)pvVar1 + 0x2d8) = iVar4;
      }
      iVar4 = isoent_tree(a,&local_28);
      if (iVar4 != 0) {
        return iVar4;
      }
      if (local_28->file != file) {
        return 0;
      }
      mVar2 = archive_entry_filetype(file->entry);
      if (mVar2 != 0x8000) {
        return iVar3;
      }
      *(isofile **)((long)pvVar1 + 0x10) = file;
      uVar5 = archive_entry_nlink(file->entry);
      if ((1 < uVar5) && (iVar4 = isofile_register_hardlink(a,file), iVar4 != 0)) {
        return -0x1e;
      }
      if (-1 < *(int *)((long)pvVar1 + 8)) {
LAB_0041870e:
        (file->content).offset_of_temp =
             (*(long *)((long)a->format_data + 0x102f0) - *(long *)((long)a->format_data + 0x102e0))
             + 0x10000;
        file->cur_content = &file->content;
        iVar4 = zisofs_init(a,file);
        if (iVar3 <= iVar4) {
          iVar4 = iVar3;
        }
        lVar6 = archive_entry_size(file->entry);
        *(la_int64_t *)((long)pvVar1 + 0x38) = lVar6;
        return iVar4;
      }
      iVar4 = __archive_mktemp((char *)0x0);
      *(int *)((long)pvVar1 + 8) = iVar4;
      if (-1 < iVar4) goto LAB_0041870e;
      piVar7 = __errno_location();
      iVar3 = *piVar7;
      fmt = "Couldn\'t create temporary file";
      goto LAB_00418773;
    }
  }
  fmt = "Can\'t allocate data";
  iVar3 = 0xc;
LAB_00418773:
  archive_set_error(&a->archive,iVar3,fmt);
  return -0x1e;
}

Assistant:

static int
iso9660_write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct iso9660 *iso9660;
	struct isofile *file;
	struct isoent *isoent;
	int r, ret = ARCHIVE_OK;

	iso9660 = a->format_data;

	iso9660->cur_file = NULL;
	iso9660->bytes_remaining = 0;
	iso9660->need_multi_extent = 0;
	if (archive_entry_filetype(entry) == AE_IFLNK
	    && iso9660->opt.rr == OPT_RR_DISABLED) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Ignore symlink file.");
		iso9660->cur_file = NULL;
		return (ARCHIVE_WARN);
	}
	if (archive_entry_filetype(entry) == AE_IFREG &&
	    archive_entry_size(entry) >= MULTI_EXTENT_SIZE) {
		if (iso9660->opt.iso_level < 3) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Ignore over %lld bytes file. "
			    "This file too large.",
			    MULTI_EXTENT_SIZE);
				iso9660->cur_file = NULL;
			return (ARCHIVE_WARN);
		}
		iso9660->need_multi_extent = 1;
	}

	file = isofile_new(a, entry);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	r = isofile_gen_utility_names(a, file);
	if (r < ARCHIVE_WARN) {
		isofile_free(file);
		return (r);
	}
	else if (r < ret)
		ret = r;

	/*
	 * Ignore a path which looks like the top of directory name
	 * since we have already made the root directory of an ISO image.
	 */
	if (archive_strlen(&(file->parentdir)) == 0 &&
	    archive_strlen(&(file->basename)) == 0) {
		isofile_free(file);
		return (r);
	}

	isofile_add_entry(iso9660, file);
	isoent = isoent_new(file);
	if (isoent == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	if (isoent->file->dircnt > iso9660->dircnt_max)
		iso9660->dircnt_max = isoent->file->dircnt;

	/* Add the current file into tree */
	r = isoent_tree(a, &isoent);
	if (r != ARCHIVE_OK)
		return (r);

	/* If there is the same file in tree and
	 * the current file is older than the file in tree.
	 * So we don't need the current file data anymore. */
	if (isoent->file != file)
		return (ARCHIVE_OK);

	/* Non regular files contents are unneeded to be saved to
	 * temporary files. */
	if (archive_entry_filetype(file->entry) != AE_IFREG)
		return (ret);

	/*
	 * Set the current file to cur_file to read its contents.
	 */
	iso9660->cur_file = file;

	if (archive_entry_nlink(file->entry) > 1) {
		r = isofile_register_hardlink(a, file);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/*
	 * Prepare to save the contents of the file.
	 */
	if (iso9660->temp_fd < 0) {
		iso9660->temp_fd = __archive_mktemp(NULL);
		if (iso9660->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
	}

	/* Save an offset of current file in temporary file. */
	file->content.offset_of_temp = wb_offset(a);
	file->cur_content = &(file->content);
	r = zisofs_init(a, file);
	if (r < ret)
		ret = r;
	iso9660->bytes_remaining =  archive_entry_size(file->entry);

	return (ret);
}